

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

NETSOCKET net_tcp_create(NETADDR bindaddr)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  NETSOCKET NVar5;
  sockaddr_in addr;
  NETADDR tmpbindaddr;
  sockaddr_in6 local_64;
  NETADDR local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.type = addr.sin_addr.s_addr;
  uVar4 = 0;
  uVar3 = 0xffffffff00000000;
  if ((addr.sin_addr.s_addr & 1) != 0) {
    local_48.type = 1;
    netaddr_to_sockaddr_in(&local_48,(sockaddr_in *)&local_64);
    uVar1 = priv_net_create_socket(2,1,(sockaddr *)&local_64,0x10,0);
    uVar4 = (ulong)(-1 < (int)uVar1);
    if (-1 < (int)uVar1) {
      uVar3 = (ulong)uVar1 << 0x20;
    }
  }
  iVar2 = -1;
  if ((addr.sin_addr.s_addr & 2) != 0) {
    local_48.type = 2;
    netaddr_to_sockaddr_in6(&local_48,&local_64);
    iVar2 = priv_net_create_socket(10,1,(sockaddr *)&local_64,0x1c,0);
    uVar1 = (uint)uVar4 + 2;
    if (iVar2 < 0) {
      uVar1 = (uint)uVar4;
    }
    uVar4 = (ulong)uVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    NVar5.ipv6sock = iVar2;
    NVar5.type = (int)(uVar3 | uVar4);
    NVar5.ipv4sock = (int)((uVar3 | uVar4) >> 0x20);
    return NVar5;
  }
  __stack_chk_fail();
}

Assistant:

NETSOCKET net_tcp_create(NETADDR bindaddr)
{
	NETSOCKET sock = invalid_socket;
	NETADDR tmpbindaddr = bindaddr;

	if(bindaddr.type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV4;
		netaddr_to_sockaddr_in(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET, SOCK_STREAM, (struct sockaddr *)&addr, sizeof(addr), 0);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV4;
			sock.ipv4sock = socket;
		}
	}

	if(bindaddr.type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV6;
		netaddr_to_sockaddr_in6(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET6, SOCK_STREAM, (struct sockaddr *)&addr, sizeof(addr), 0);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV6;
			sock.ipv6sock = socket;
		}
	}

	/* return */
	return sock;
}